

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *environment_00;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  size_t local_c0;
  size_t i;
  size_t chainedMessageCount;
  undefined1 auStack_a8 [7];
  _Bool hasReceiver;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_24354580 gcFrame;
  sysbvm_astMessageChainNode_t **chainNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  environment_00 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_a8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
  chainedMessageCount._7_1_ = false;
  if (*(long *)(*arguments + 0x28) != 0) {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*arguments + 0x28),*environment_00);
    chainedMessageCount._7_1_ = true;
    sVar1 = sysbvm_tuple_getType(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    sVar2 = sysbvm_tuple_getType(context,sVar1);
    sVar2 = sysbvm_type_getAnalyzeAndEvaluateMessageChainNodeForReceiverWithEnvironmentFunction
                      (context,sVar2);
    if (sVar2 != 0) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      sVar1 = sysbvm_function_apply4
                        (context,sVar2,sVar1,*arguments,(sysbvm_tuple_t)gcFrameRecord.roots,
                         *environment_00);
      return sVar1;
    }
  }
  sVar3 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x38));
  for (local_c0 = 0; local_c0 < sVar3; local_c0 = local_c0 + 1) {
    sVar1 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x38),local_c0);
    gcFrame.chainedMessage =
         sysbvm_astMessageChainMessageNode_analyzeAndEvaluate
                   (context,sVar1,chainedMessageCount._7_1_,(sysbvm_tuple_t *)&gcFrameRecord.roots,
                    environment_00);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.chainedMessage;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageChainNode_t **chainNode = (sysbvm_astMessageChainNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t chainedMessage;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*chainNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*chainNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*chainNode)->receiver, *environment);
        hasReceiver = true;

        gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndEvaluateMessageChainNodeForReceiverWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.receiverType));
        if(gcFrame.analysisFunction)
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_function_apply4(context, gcFrame.analysisFunction, gcFrame.receiverType, *node, gcFrame.receiver, *environment);
        }
    }

    size_t chainedMessageCount = sysbvm_array_getSize((*chainNode)->messages);
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessage = sysbvm_array_at((*chainNode)->messages, i);
        gcFrame.result = sysbvm_astMessageChainMessageNode_analyzeAndEvaluate(context, gcFrame.chainedMessage, hasReceiver, &gcFrame.receiver, environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}